

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O0

void print_usage(void)

{
  printf(
        "\nUsage: forestdb_hexamine [OPTION]... [filename]\n\n-  Loads entire file in memory and hangs in gdb_loop for examination\n\nOptions:\n\n      --print-header     displays KV info (for non-corrupted files)\n      --headers-only     only dump contents of all DB headers and exit\n      --max-filesize     reset maximum file size (default 1.5GB)\n"
        );
  return;
}

Assistant:

void print_usage(void)
{
    printf("\nUsage: forestdb_hexamine [OPTION]... [filename]\n"
    "\n-  Loads entire file in memory and hangs in gdb_loop for examination\n"
    "\nOptions:\n"
    "\n      --print-header     displays KV info (for non-corrupted files)"
    "\n      --headers-only     only dump contents of all DB headers and exit"
    "\n      --max-filesize     reset maximum file size (default 1.5GB)"
    "\n");
}